

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::VMContext::withInterpreter(VMContext *this,WithInterpreterBlock *block)

{
  anon_class_16_2_f791057a local_48;
  StackMemoryEntry local_38;
  WithInterpreterBlock *local_18;
  WithInterpreterBlock *block_local;
  VMContext *this_local;
  
  local_48.this = this;
  local_48.block = block;
  local_18 = block;
  block_local = (WithInterpreterBlock *)this;
  std::function<void(Lodtalk::StackMemory*)>::
  function<Lodtalk::VMContext::withInterpreter(std::function<void(Lodtalk::InterpreterProxy*)>const&)::__0,void>
            ((function<void(Lodtalk::StackMemory*)> *)&local_38,&local_48);
  withStackMemory(this,&local_38);
  std::function<void_(Lodtalk::StackMemory_*)>::~function(&local_38);
  return;
}

Assistant:

void VMContext::withInterpreter(const WithInterpreterBlock &block)
{
    withStackMemory(this, [&](StackMemory *stack) {
		StackInterpreter interpreter(this, stack);
        StackInterpreterProxy proxy(&interpreter);
		block(&proxy);
	});

}